

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::InterCallTestCase::init
          (InterCallTestCase *this,EVP_PKEY_CTX *ctx)

{
  ShaderProgram *pSVar1;
  int iVar2;
  bool bVar3;
  GLuint GVar4;
  RenderContext *pRVar5;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  size_type sVar6;
  const_reference pvVar7;
  mapped_type *pmVar8;
  TestLog *pTVar9;
  MessageBuilder *pMVar10;
  TestError *pTVar11;
  reference ppSVar12;
  reference pvVar13;
  allocator<char> local_ae1;
  string local_ae0;
  MessageBuilder local_ac0;
  ShaderProgram *local_940;
  ShaderProgram *program_5;
  _Self local_930;
  CommandUnion *local_928;
  ReadZeroData *cmd_5;
  string local_918;
  MessageBuilder local_8f8;
  ShaderProgram *local_778;
  ShaderProgram *program_4;
  ReadDataInterleaved *cmd_4;
  string local_760;
  MessageBuilder local_740;
  ShaderProgram *local_5c0;
  ShaderProgram *program_3;
  _Self local_5b0;
  CommandUnion *local_5a8;
  WriteDataInterleaved *cmd_3;
  string local_598;
  MessageBuilder local_578;
  ShaderProgram *local_3f8;
  ShaderProgram *program_2;
  ReadMultipleData *cmd_2;
  string local_3e0;
  MessageBuilder local_3c0;
  ShaderProgram *local_240;
  ShaderProgram *program_1;
  ReadData *cmd_1;
  string local_228;
  MessageBuilder local_208;
  ShaderProgram *local_88;
  ShaderProgram *program;
  _Self local_78;
  CommandUnion *local_70;
  WriteData *cmd;
  int step;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  deUint32 local_20;
  ContextType local_1c;
  undefined1 local_15;
  int local_14;
  bool supportsES32;
  InterCallTestCase *pIStack_10;
  int programFriendlyName;
  InterCallTestCase *this_local;
  
  local_14 = 0;
  pIStack_10 = this;
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  local_1c.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  local_20 = (deUint32)glu::ApiType::es(3,2);
  local_15 = glu::contextSupports(local_1c,(ApiType)local_20);
  if ((((this->m_useAtomic & 1U) != 0) && (this->m_storage == STORAGE_IMAGE)) && (!(bool)local_15))
  {
    this_00 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
    bVar3 = glu::ContextInfo::isExtensionSupported(this_00,"GL_OES_shader_image_atomic");
    if (!bVar3) {
      local_55 = 1;
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Test requires GL_OES_shader_image_atomic extension",&local_41)
      ;
      tcu::NotSupportedError::NotSupportedError(this_01,&local_40);
      local_55 = 0;
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  sVar6 = std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
          ::size(&this->m_cmds);
  _step = (value_type)0x0;
  std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::resize
            (&this->m_operationPrograms,sVar6,(value_type *)&step);
  sVar6 = std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
          ::size(&this->m_cmds);
  cmd._4_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->m_operationResultStorages,sVar6,(value_type_conflict4 *)((long)&cmd + 4));
  cmd._0_4_ = 0;
  do {
    iVar2 = (int)cmd;
    sVar6 = std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
            ::size(&this->m_cmds);
    if ((int)sVar6 <= iVar2) {
      return iVar2;
    }
    pvVar7 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
             ::operator[](&this->m_cmds,(long)(int)cmd);
    switch(pvVar7->type) {
    case TYPE_WRITE:
      pvVar7 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
               ::operator[](&this->m_cmds,(long)(int)cmd);
      local_70 = &pvVar7->u_cmd;
      local_78._M_node =
           (_Base_ptr)
           std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::find(&this->m_storageIDs,&(local_70->readZero).targetHandle);
      program = (ShaderProgram *)
                std::
                map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                ::end(&this->m_storageIDs);
      bVar3 = std::operator==(&local_78,(_Self *)&program);
      if (bVar3) {
        GVar4 = genStorage(this,(local_70->write).targetHandle);
        pmVar8 = std::
                 map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                 ::operator[](&this->m_storageIDs,&(local_70->readZero).targetHandle);
        *pmVar8 = GVar4;
      }
      local_88 = genWriteProgram(this,(local_70->write).seed);
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_208,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<(&local_208,(char (*) [10])"Program #");
      local_14 = local_14 + 1;
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_14);
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_208);
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      glu::operator<<(pTVar9,local_88);
      bVar3 = glu::ShaderProgram::isOk(local_88);
      pSVar1 = local_88;
      if (!bVar3) {
        cmd_1._6_1_ = 1;
        pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"could not build program",
                   (allocator<char> *)((long)&cmd_1 + 7));
        tcu::TestError::TestError(pTVar11,&local_228);
        cmd_1._6_1_ = 0;
        __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      ppSVar12 = std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::
                 operator[](&this->m_operationPrograms,(long)(int)cmd);
      *ppSVar12 = pSVar1;
      break;
    case TYPE_READ:
      pvVar7 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
               ::operator[](&this->m_cmds,(long)(int)cmd);
      program_1 = (ShaderProgram *)&pvVar7->u_cmd;
      local_240 = genReadProgram(this,(pvVar7->u_cmd).write.seed);
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_3c0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<(&local_3c0,(char (*) [10])"Program #");
      local_14 = local_14 + 1;
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_14);
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3c0);
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      glu::operator<<(pTVar9,local_240);
      bVar3 = glu::ShaderProgram::isOk(local_240);
      pSVar1 = local_240;
      if (!bVar3) {
        cmd_2._6_1_ = 1;
        pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3e0,"could not build program",
                   (allocator<char> *)((long)&cmd_2 + 7));
        tcu::TestError::TestError(pTVar11,&local_3e0);
        cmd_2._6_1_ = 0;
        __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      ppSVar12 = std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::
                 operator[](&this->m_operationPrograms,(long)(int)cmd);
      *ppSVar12 = pSVar1;
      GVar4 = genResultStorage(this);
      pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->m_operationResultStorages,(long)(int)cmd);
      *pvVar13 = GVar4;
      break;
    case TYPE_BARRIER:
      break;
    case TYPE_READ_MULTIPLE:
      pvVar7 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
               ::operator[](&this->m_cmds,(long)(int)cmd);
      program_2 = (ShaderProgram *)&pvVar7->u_cmd;
      local_3f8 = genReadMultipleProgram
                            (this,(pvVar7->u_cmd).write.seed,(pvVar7->u_cmd).readMulti.seed1);
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_578,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<(&local_578,(char (*) [10])"Program #");
      local_14 = local_14 + 1;
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_14);
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_578);
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      glu::operator<<(pTVar9,local_3f8);
      bVar3 = glu::ShaderProgram::isOk(local_3f8);
      pSVar1 = local_3f8;
      if (!bVar3) {
        cmd_3._6_1_ = 1;
        pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_598,"could not build program",
                   (allocator<char> *)((long)&cmd_3 + 7));
        tcu::TestError::TestError(pTVar11,&local_598);
        cmd_3._6_1_ = 0;
        __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      ppSVar12 = std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::
                 operator[](&this->m_operationPrograms,(long)(int)cmd);
      *ppSVar12 = pSVar1;
      GVar4 = genResultStorage(this);
      pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->m_operationResultStorages,(long)(int)cmd);
      *pvVar13 = GVar4;
      break;
    case TYPE_WRITE_INTERLEAVE:
      pvVar7 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
               ::operator[](&this->m_cmds,(long)(int)cmd);
      local_5a8 = &pvVar7->u_cmd;
      local_5b0._M_node =
           (_Base_ptr)
           std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::find(&this->m_storageIDs,&(local_5a8->readZero).targetHandle);
      program_3 = (ShaderProgram *)
                  std::
                  map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                  ::end(&this->m_storageIDs);
      bVar3 = std::operator==(&local_5b0,(_Self *)&program_3);
      if (bVar3) {
        GVar4 = genStorage(this,(local_5a8->write).targetHandle);
        pmVar8 = std::
                 map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                 ::operator[](&this->m_storageIDs,&(local_5a8->readZero).targetHandle);
        *pmVar8 = GVar4;
      }
      local_5c0 = genWriteInterleavedProgram
                            (this,(local_5a8->write).seed,
                             (bool)((local_5a8->writeInterleave).evenOdd & 1));
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_740,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<(&local_740,(char (*) [10])"Program #");
      local_14 = local_14 + 1;
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_14);
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_740);
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      glu::operator<<(pTVar9,local_5c0);
      bVar3 = glu::ShaderProgram::isOk(local_5c0);
      pSVar1 = local_5c0;
      if (!bVar3) {
        cmd_4._6_1_ = 1;
        pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_760,"could not build program",
                   (allocator<char> *)((long)&cmd_4 + 7));
        tcu::TestError::TestError(pTVar11,&local_760);
        cmd_4._6_1_ = 0;
        __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      ppSVar12 = std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::
                 operator[](&this->m_operationPrograms,(long)(int)cmd);
      *ppSVar12 = pSVar1;
      break;
    case TYPE_READ_INTERLEAVE:
      pvVar7 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
               ::operator[](&this->m_cmds,(long)(int)cmd);
      program_4 = (ShaderProgram *)&pvVar7->u_cmd;
      local_778 = genReadInterleavedProgram
                            (this,(pvVar7->u_cmd).write.seed,(pvVar7->u_cmd).readMulti.targetHandle1
                            );
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_8f8,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<(&local_8f8,(char (*) [10])"Program #");
      local_14 = local_14 + 1;
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_14);
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_8f8);
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      glu::operator<<(pTVar9,local_778);
      bVar3 = glu::ShaderProgram::isOk(local_778);
      pSVar1 = local_778;
      if (!bVar3) {
        cmd_5._6_1_ = 1;
        pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_918,"could not build program",
                   (allocator<char> *)((long)&cmd_5 + 7));
        tcu::TestError::TestError(pTVar11,&local_918);
        cmd_5._6_1_ = 0;
        __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      ppSVar12 = std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::
                 operator[](&this->m_operationPrograms,(long)(int)cmd);
      *ppSVar12 = pSVar1;
      GVar4 = genResultStorage(this);
      pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->m_operationResultStorages,(long)(int)cmd);
      *pvVar13 = GVar4;
      break;
    case TYPE_READ_ZERO:
      pvVar7 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
               ::operator[](&this->m_cmds,(long)(int)cmd);
      local_928 = &pvVar7->u_cmd;
      local_930._M_node =
           (_Base_ptr)
           std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::find(&this->m_storageIDs,&(local_928->readZero).targetHandle);
      program_5 = (ShaderProgram *)
                  std::
                  map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                  ::end(&this->m_storageIDs);
      bVar3 = std::operator==(&local_930,(_Self *)&program_5);
      if (bVar3) {
        GVar4 = genStorage(this,(local_928->write).targetHandle);
        pmVar8 = std::
                 map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                 ::operator[](&this->m_storageIDs,&(local_928->readZero).targetHandle);
        *pmVar8 = GVar4;
      }
      local_940 = genReadZeroProgram(this);
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_ac0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<(&local_ac0,(char (*) [10])"Program #");
      local_14 = local_14 + 1;
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_14);
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_ac0);
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      glu::operator<<(pTVar9,local_940);
      bVar3 = glu::ShaderProgram::isOk(local_940);
      pSVar1 = local_940;
      if (!bVar3) {
        pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ae0,"could not build program",&local_ae1);
        tcu::TestError::TestError(pTVar11,&local_ae0);
        __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      ppSVar12 = std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::
                 operator[](&this->m_operationPrograms,(long)(int)cmd);
      *ppSVar12 = pSVar1;
      GVar4 = genResultStorage(this);
      pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->m_operationResultStorages,(long)(int)cmd);
      *pvVar13 = GVar4;
    }
    cmd._0_4_ = (int)cmd + 1;
  } while( true );
}

Assistant:

void InterCallTestCase::init (void)
{
	int			programFriendlyName = 0;
	const bool	supportsES32		= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	// requirements

	if (m_useAtomic && m_storage == STORAGE_IMAGE && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_OES_shader_image_atomic"))
		throw tcu::NotSupportedError("Test requires GL_OES_shader_image_atomic extension");

	// generate resources and validate command list

	m_operationPrograms.resize(m_cmds.size(), DE_NULL);
	m_operationResultStorages.resize(m_cmds.size(), 0);

	for (int step = 0; step < (int)m_cmds.size(); ++step)
	{
		switch (m_cmds[step].type)
		{
			case InterCallOperations::Command::TYPE_WRITE:
			{
				const op::WriteData& cmd = m_cmds[step].u_cmd.write;

				// new storage handle?
				if (m_storageIDs.find(cmd.targetHandle) == m_storageIDs.end())
					m_storageIDs[cmd.targetHandle] = genStorage(cmd.targetHandle);

				// program
				{
					glu::ShaderProgram* program = genWriteProgram(cmd.seed);

					m_testCtx.getLog() << tcu::TestLog::Message << "Program #" << ++programFriendlyName << tcu::TestLog::EndMessage;
					m_testCtx.getLog() << *program;

					if (!program->isOk())
						throw tcu::TestError("could not build program");

					m_operationPrograms[step] = program;
				}
				break;
			}

			case InterCallOperations::Command::TYPE_READ:
			{
				const op::ReadData& cmd = m_cmds[step].u_cmd.read;
				DE_ASSERT(m_storageIDs.find(cmd.targetHandle) != m_storageIDs.end());

				// program and result storage
				{
					glu::ShaderProgram* program = genReadProgram(cmd.seed);

					m_testCtx.getLog() << tcu::TestLog::Message << "Program #" << ++programFriendlyName << tcu::TestLog::EndMessage;
					m_testCtx.getLog() << *program;

					if (!program->isOk())
						throw tcu::TestError("could not build program");

					m_operationPrograms[step] = program;
					m_operationResultStorages[step] = genResultStorage();
				}
				break;
			}

			case InterCallOperations::Command::TYPE_BARRIER:
			{
				break;
			}

			case InterCallOperations::Command::TYPE_READ_MULTIPLE:
			{
				const op::ReadMultipleData& cmd = m_cmds[step].u_cmd.readMulti;
				DE_ASSERT(m_storageIDs.find(cmd.targetHandle0) != m_storageIDs.end());
				DE_ASSERT(m_storageIDs.find(cmd.targetHandle1) != m_storageIDs.end());

				// program
				{
					glu::ShaderProgram* program = genReadMultipleProgram(cmd.seed0, cmd.seed1);

					m_testCtx.getLog() << tcu::TestLog::Message << "Program #" << ++programFriendlyName << tcu::TestLog::EndMessage;
					m_testCtx.getLog() << *program;

					if (!program->isOk())
						throw tcu::TestError("could not build program");

					m_operationPrograms[step] = program;
					m_operationResultStorages[step] = genResultStorage();
				}
				break;
			}

			case InterCallOperations::Command::TYPE_WRITE_INTERLEAVE:
			{
				const op::WriteDataInterleaved& cmd = m_cmds[step].u_cmd.writeInterleave;

				// new storage handle?
				if (m_storageIDs.find(cmd.targetHandle) == m_storageIDs.end())
					m_storageIDs[cmd.targetHandle] = genStorage(cmd.targetHandle);

				// program
				{
					glu::ShaderProgram* program = genWriteInterleavedProgram(cmd.seed, cmd.evenOdd);

					m_testCtx.getLog() << tcu::TestLog::Message << "Program #" << ++programFriendlyName << tcu::TestLog::EndMessage;
					m_testCtx.getLog() << *program;

					if (!program->isOk())
						throw tcu::TestError("could not build program");

					m_operationPrograms[step] = program;
				}
				break;
			}

			case InterCallOperations::Command::TYPE_READ_INTERLEAVE:
			{
				const op::ReadDataInterleaved& cmd = m_cmds[step].u_cmd.readInterleave;
				DE_ASSERT(m_storageIDs.find(cmd.targetHandle) != m_storageIDs.end());

				// program
				{
					glu::ShaderProgram* program = genReadInterleavedProgram(cmd.seed0, cmd.seed1);

					m_testCtx.getLog() << tcu::TestLog::Message << "Program #" << ++programFriendlyName << tcu::TestLog::EndMessage;
					m_testCtx.getLog() << *program;

					if (!program->isOk())
						throw tcu::TestError("could not build program");

					m_operationPrograms[step] = program;
					m_operationResultStorages[step] = genResultStorage();
				}
				break;
			}

			case InterCallOperations::Command::TYPE_READ_ZERO:
			{
				const op::ReadZeroData& cmd = m_cmds[step].u_cmd.readZero;

				// new storage handle?
				if (m_storageIDs.find(cmd.targetHandle) == m_storageIDs.end())
					m_storageIDs[cmd.targetHandle] = genStorage(cmd.targetHandle);

				// program
				{
					glu::ShaderProgram* program = genReadZeroProgram();

					m_testCtx.getLog() << tcu::TestLog::Message << "Program #" << ++programFriendlyName << tcu::TestLog::EndMessage;
					m_testCtx.getLog() << *program;

					if (!program->isOk())
						throw tcu::TestError("could not build program");

					m_operationPrograms[step] = program;
					m_operationResultStorages[step] = genResultStorage();
				}
				break;
			}

			default:
				DE_ASSERT(DE_FALSE);
		}
	}
}